

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<int,2ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<int,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_2UL>_>_>_>
          *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  char c;
  array<int,_2UL> value;
  char local_59;
  array<int,_2UL> local_58;
  string local_50;
  
  if (*(long *)(result + 8) != *(long *)result) {
    *(long *)(result + 8) = *(long *)result;
  }
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    bVar2 = MaybeNone(this);
    if (bVar2) {
      local_50._M_dataplus._M_p._0_4_ = (uint)local_50._M_dataplus._M_p & 0xffffff00;
      local_50._M_dataplus._M_p._4_4_ = 0;
      local_50._M_string_length._0_4_ = 0;
      ::std::
      vector<nonstd::optional_lite::optional<std::array<int,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,2ul>>>>
      ::emplace_back<nonstd::optional_lite::optional<std::array<int,2ul>>>
                ((vector<nonstd::optional_lite::optional<std::array<int,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,2ul>>>>
                  *)result,(optional<std::array<int,_2UL>_> *)&local_50);
    }
    else {
      bVar2 = ParseBasicTypeTuple<int,2ul>(this,&local_58);
      if (bVar2) {
        local_50._M_dataplus._M_p._0_4_ = CONCAT31(local_50._M_dataplus._M_p._1_3_,1);
        local_50._M_dataplus._M_p._4_4_ = local_58._M_elems[0];
        local_50._M_string_length._0_4_ = local_58._M_elems[1];
        ::std::
        vector<nonstd::optional_lite::optional<std::array<int,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,2ul>>>>
        ::emplace_back<nonstd::optional_lite::optional<std::array<int,2ul>>>
                  ((vector<nonstd::optional_lite::optional<std::array<int,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,2ul>>>>
                    *)result,(optional<std::array<int,_2UL>_> *)&local_50);
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Not starting with the tuple value of requested type.\n","");
        PushError(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (!bVar2) {
        return false;
      }
    }
    do {
      pSVar1 = this->_sr;
      if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
      goto LAB_003fa37c;
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      bVar2 = Char1(this,&local_59);
      iVar4 = 1;
      if (bVar2) {
        if (local_59 == sep) {
          bVar2 = SkipWhitespaceAndNewline(this,true);
          if (bVar2) {
            bVar2 = MaybeNone(this);
            if (bVar2) {
              local_50._M_dataplus._M_p._0_4_ = (uint)local_50._M_dataplus._M_p & 0xffffff00;
              local_50._M_dataplus._M_p._4_4_ = 0;
              local_50._M_string_length._0_4_ = 0;
              ::std::
              vector<nonstd::optional_lite::optional<std::array<int,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,2ul>>>>
              ::emplace_back<nonstd::optional_lite::optional<std::array<int,2ul>>>
                        ((vector<nonstd::optional_lite::optional<std::array<int,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,2ul>>>>
                          *)result,(optional<std::array<int,_2UL>_> *)&local_50);
            }
            else {
              bVar2 = ParseBasicTypeTuple<int,2ul>(this,&local_58);
              iVar4 = 3;
              if (!bVar2) goto LAB_003fa36d;
              local_50._M_dataplus._M_p._0_4_ = CONCAT31(local_50._M_dataplus._M_p._1_3_,1);
              local_50._M_dataplus._M_p._4_4_ = local_58._M_elems[0];
              local_50._M_string_length._0_4_ = local_58._M_elems[1];
              ::std::
              vector<nonstd::optional_lite::optional<std::array<int,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,2ul>>>>
              ::emplace_back<nonstd::optional_lite::optional<std::array<int,2ul>>>
                        ((vector<nonstd::optional_lite::optional<std::array<int,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,2ul>>>>
                          *)result,(optional<std::array<int,_2UL>_> *)&local_50);
            }
            iVar4 = 0;
          }
        }
        else {
          pSVar1 = this->_sr;
          iVar4 = 3;
          if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_)) {
            pSVar1->idx_ = uVar3;
          }
        }
      }
LAB_003fa36d:
    } while (iVar4 == 0);
    if (iVar4 != 1) {
LAB_003fa37c:
      if (*(long *)result != *(long *)(result + 8)) {
        return true;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Empty array.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}